

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch.cc
# Opt level: O0

Point __thiscall
Patch::new_position_for_new_offset
          (Patch *this,uint32_t target_offset,
          function<unsigned_int_(Point)> *old_offset_for_old_position,
          function<Point_(unsigned_int)> *old_position_for_old_offset)

{
  uint uVar1;
  int iVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  pointer this_00;
  Point PVar5;
  Point local_b8;
  Point local_b0;
  Point local_a8;
  Point local_a0;
  Point local_98;
  uint local_90;
  uint local_8c;
  uint32_t node_old_end_offset;
  uint32_t node_new_end_offset;
  uint32_t node_new_start_offset;
  uint local_7c;
  Point PStack_78;
  uint32_t node_old_start_offset;
  Point node_new_start;
  Point node_old_start;
  uint32_t preceding_new_offset;
  uint32_t preceding_old_offset;
  Point preceding_old_position;
  Point preceding_new_position;
  PositionStackEntry left_ancestor_info;
  Node *node;
  function<Point_(unsigned_int)> *old_position_for_old_offset_local;
  function<unsigned_int_(Point)> *old_offset_for_old_position_local;
  uint32_t target_offset_local;
  Patch *this_local;
  
  left_ancestor_info._16_8_ = this->root;
  PositionStackEntry::PositionStackEntry((PositionStackEntry *)&preceding_new_position);
  Point::Point(&preceding_old_position);
  Point::Point((Point *)&preceding_new_offset);
  node_old_start.column = 0;
  node_old_start.row = 0;
  while (left_ancestor_info._16_8_ != 0) {
    node_new_start =
         Point::traverse(&preceding_new_position,(Point *)(left_ancestor_info._16_8_ + 0x20));
    PStack_78 = Point::traverse(&left_ancestor_info.old_end,
                                (Point *)(left_ancestor_info._16_8_ + 0x28));
    _node_new_end_offset = node_new_start;
    local_7c = std::function<unsigned_int_(Point)>::operator()
                         (old_offset_for_old_position,node_new_start);
    iVar2 = (local_7c - left_ancestor_info.new_end.row) + left_ancestor_info.new_end.column;
    uVar3 = Node::left_subtree_old_text_size((Node *)left_ancestor_info._16_8_);
    uVar4 = Node::left_subtree_new_text_size((Node *)left_ancestor_info._16_8_);
    uVar4 = (iVar2 - uVar3) + uVar4;
    node_old_end_offset = uVar4;
    uVar3 = Node::new_text_size((Node *)left_ancestor_info._16_8_);
    uVar1 = local_7c;
    local_8c = uVar4 + uVar3;
    uVar3 = Node::old_text_size((Node *)left_ancestor_info._16_8_);
    local_90 = uVar1 + uVar3;
    if (target_offset < local_8c) {
      if (node_old_end_offset <= target_offset) {
        this_00 = std::unique_ptr<Text,_std::default_delete<Text>_>::operator->
                            ((unique_ptr<Text,_std::default_delete<Text>_> *)
                             (left_ancestor_info._16_8_ + 0x38));
        local_a8 = Text::position_for_offset(this_00,target_offset - node_old_end_offset,0,true);
        PVar5 = Point::traverse(&stack0xffffffffffffff88,&local_a8);
        return PVar5;
      }
      if (*(long *)left_ancestor_info._16_8_ == 0) break;
      left_ancestor_info._16_8_ = *(undefined8 *)left_ancestor_info._16_8_;
    }
    else {
      local_98 = Point::traverse(&node_new_start,(Point *)(left_ancestor_info._16_8_ + 0x10));
      _preceding_new_offset = local_98;
      local_a0 = Point::traverse(&stack0xffffffffffffff88,
                                 (Point *)(left_ancestor_info._16_8_ + 0x18));
      node_old_start.column = local_90;
      node_old_start.row = local_8c;
      preceding_old_position = local_a0;
      if (*(long *)(left_ancestor_info._16_8_ + 8) == 0) break;
      preceding_new_position = _preceding_new_offset;
      left_ancestor_info.old_end = local_a0;
      uVar3 = Node::left_subtree_old_text_size((Node *)left_ancestor_info._16_8_);
      uVar4 = Node::old_text_size((Node *)left_ancestor_info._16_8_);
      left_ancestor_info.new_end.row = uVar3 + uVar4 + left_ancestor_info.new_end.row;
      uVar3 = Node::left_subtree_new_text_size((Node *)left_ancestor_info._16_8_);
      uVar4 = Node::new_text_size((Node *)left_ancestor_info._16_8_);
      left_ancestor_info.new_end.column = uVar3 + uVar4 + left_ancestor_info.new_end.column;
      left_ancestor_info._16_8_ = *(undefined8 *)(left_ancestor_info._16_8_ + 8);
    }
  }
  local_b8 = std::function<Point_(unsigned_int)>::operator()
                       (old_position_for_old_offset,
                        node_old_start.column + (target_offset - node_old_start.row));
  local_b0 = Point::traversal(&local_b8,(Point *)&preceding_new_offset);
  PVar5 = Point::traverse(&preceding_old_position,&local_b0);
  return PVar5;
}

Assistant:

Point Patch::new_position_for_new_offset(uint32_t target_offset,
                                         function<uint32_t(Point)> old_offset_for_old_position,
                                         function<Point(uint32_t)> old_position_for_old_offset) const {
  const Node *node = root;
  Patch::PositionStackEntry left_ancestor_info;
  Point preceding_new_position, preceding_old_position;
  uint32_t preceding_old_offset = 0, preceding_new_offset = 0;

  while (node) {
    Point node_old_start = left_ancestor_info.old_end.traverse(node->old_distance_from_left_ancestor);
    Point node_new_start = left_ancestor_info.new_end.traverse(node->new_distance_from_left_ancestor);
    uint32_t node_old_start_offset = old_offset_for_old_position(node_old_start);
    uint32_t node_new_start_offset = node_old_start_offset -
      left_ancestor_info.total_old_text_size +
      left_ancestor_info.total_new_text_size -
      node->left_subtree_old_text_size() +
      node->left_subtree_new_text_size();
    uint32_t node_new_end_offset = node_new_start_offset + node->new_text_size();
    uint32_t node_old_end_offset = node_old_start_offset + node->old_text_size();

    if (node_new_end_offset <= target_offset) {
      preceding_old_position = node_old_start.traverse(node->old_extent);
      preceding_new_position = node_new_start.traverse(node->new_extent);
      preceding_old_offset = node_old_end_offset;
      preceding_new_offset = node_new_end_offset;
      if (node->right) {
        left_ancestor_info.old_end = preceding_old_position;
        left_ancestor_info.new_end = preceding_new_position;
        left_ancestor_info.total_old_text_size += node->left_subtree_old_text_size() + node->old_text_size();
        left_ancestor_info.total_new_text_size += node->left_subtree_new_text_size() + node->new_text_size();
        node = node->right;
      } else {
        break;
      }
    } else if (node_new_start_offset <= target_offset) {
      return node_new_start
        .traverse(node->new_text->position_for_offset(target_offset - node_new_start_offset));
    } else {
      if (node->left) {
        node = node->left;
      } else {
        break;
      }
    }
  }

  return preceding_new_position.traverse(
    old_position_for_old_offset(
      preceding_old_offset + (target_offset - preceding_new_offset)
    ).traversal(preceding_old_position)
  );
}